

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qcombobox_p.cpp
# Opt level: O2

void QComboBoxPrivateScroller::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  if (_id == 0 && _c == InvokeMetaMethod) {
    doScroll((QComboBoxPrivateScroller *)_o,*_a[1]);
  }
  if (_c == IndexOfMethod) {
    QtMocHelpers::indexOfMethod<void(QComboBoxPrivateScroller::*)(int)>
              ((QtMocHelpers *)_a,(void **)doScroll,0,0);
    return;
  }
  return;
}

Assistant:

void QComboBoxPrivateScroller::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QComboBoxPrivateScroller *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->doScroll((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QComboBoxPrivateScroller::*)(int )>(_a, &QComboBoxPrivateScroller::doScroll, 0))
            return;
    }
}